

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solitaire.cpp
# Opt level: O0

bool __thiscall solitaire::Solitaire::isGameFinished(Solitaire *this)

{
  bool bVar1;
  const_iterator pvVar2;
  const_iterator pvVar3;
  Solitaire *this_local;
  
  pvVar2 = std::array<std::shared_ptr<solitaire::piles::interfaces::FoundationPile>,_4UL>::begin
                     (&this->foundationPiles);
  pvVar3 = std::array<std::shared_ptr<solitaire::piles::interfaces::FoundationPile>,_4UL>::end
                     (&this->foundationPiles);
  bVar1 = std::
          all_of<std::shared_ptr<solitaire::piles::interfaces::FoundationPile>const*,solitaire::Solitaire::isGameFinished()const::__0>
                    (pvVar2,pvVar3);
  return bVar1;
}

Assistant:

bool Solitaire::isGameFinished() const {
    return std::all_of(foundationPiles.begin(), foundationPiles.end(),
        [](const auto& pile) {
            return pile->getTopCardValue() == Value::King;
        }
    );
}